

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O0

void NativeCodeGenerator::LogCodeGenStart(CodeGenWorkItem *workItem,LARGE_INTEGER *start_time)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Type TVar6;
  Type TVar7;
  Type TVar8;
  Type TVar9;
  bool bVar10;
  ExecutionMode EVar11;
  uint uVar12;
  LocalFunctionId LVar13;
  ULONG UVar14;
  int iVar15;
  FunctionBody *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EntryPointInfo *pEVar16;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar17;
  CodeGenRecyclableData *pCVar18;
  FunctionCodeGenJitTimeData *pFVar19;
  FieldAccessStats **ppFVar20;
  undefined4 extraout_var_03;
  char16 *pcVar21;
  FieldAccessStats *pFVar22;
  undefined4 extraout_var_04;
  WriteBarrierPtr<Js::FieldAccessStats> local_90;
  Type stats;
  char16 debugStringBuffer [42];
  FunctionBody *body;
  LARGE_INTEGER *start_time_local;
  CodeGenWorkItem *workItem_local;
  
  this = CodeGenWorkItem::GetFunctionBody(workItem);
  bVar10 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,BackEndPhase);
  if (bVar10) {
    pEVar16 = CodeGenWorkItem::GetEntryPoint(workItem);
    bVar10 = Js::EntryPointInfo::IsLoopBody(pEVar16);
    if (bVar10) {
      iVar15 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
      uVar12 = JsLoopBodyCodeGen::GetLoopNumber((JsLoopBodyCodeGen *)workItem);
      Output::Print(L"---BeginBackEnd: function: %s, loop:%d---\r\n",CONCAT44(extraout_var,iVar15),
                    (ulong)uVar12);
    }
    else {
      iVar15 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
      Output::Print(L"---BeginBackEnd: function: %s---\r\n",CONCAT44(extraout_var_00,iVar15));
    }
    Output::Flush();
  }
  uVar12 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  LVar13 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar10 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BackEndPhase,uVar12,LVar13);
  if (bVar10) {
    QueryPerformanceCounter(start_time);
    pEVar16 = CodeGenWorkItem::GetEntryPoint(workItem);
    bVar10 = Js::EntryPointInfo::IsLoopBody(pEVar16);
    if (bVar10) {
      iVar15 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
      pcVar21 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])&stats);
      UVar14 = Js::ParseableFunctionInfo::GetLineNumber(&this->super_ParseableFunctionInfo);
      uVar12 = JsLoopBodyCodeGen::GetLoopNumber((JsLoopBodyCodeGen *)workItem);
      EVar11 = CodeGenWorkItem::GetJitMode(workItem);
      pcVar17 = ExecutionModeName(EVar11);
      Output::Print(L"BeginBackEnd - function: %s (%s, line %u), loop: %u, mode: %S",
                    CONCAT44(extraout_var_01,iVar15),pcVar21,(ulong)UVar14,(ulong)uVar12,pcVar17);
      bVar10 = Js::ParseableFunctionInfo::GetIsAsmjsMode(&this->super_ParseableFunctionInfo);
      if (bVar10) {
        Output::Print(L" (Asmjs)\n");
      }
      else {
        Output::Print(L"\n");
      }
    }
    else {
      iVar15 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
      pcVar21 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])&stats);
      UVar14 = Js::ParseableFunctionInfo::GetLineNumber(&this->super_ParseableFunctionInfo);
      EVar11 = CodeGenWorkItem::GetJitMode(workItem);
      pcVar17 = ExecutionModeName(EVar11);
      Output::Print(L"BeginBackEnd - function: %s (%s, line %u), mode: %S",
                    CONCAT44(extraout_var_02,iVar15),pcVar21,(ulong)UVar14,pcVar17);
      bVar10 = Js::ParseableFunctionInfo::GetIsAsmjsMode(&this->super_ParseableFunctionInfo);
      if (bVar10) {
        Output::Print(L" (Asmjs)\n");
      }
      else {
        Output::Print(L"\n");
      }
    }
    Output::Flush();
  }
  uVar12 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  LVar13 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar10 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecPhase,uVar12,LVar13);
  if (!bVar10) {
    uVar12 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    LVar13 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    bVar10 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,EquivObjTypeSpecPhase,uVar12,LVar13);
    if (!bVar10) {
      return;
    }
  }
  pCVar18 = CodeGenWorkItem::RecyclableData(workItem);
  pFVar19 = Js::CodeGenRecyclableData::JitTimeData(pCVar18);
  ppFVar20 = Memory::WriteBarrierPtr::operator_cast_to_FieldAccessStats__
                       ((WriteBarrierPtr *)&pFVar19->inlineCacheStats);
  if (*ppFVar20 == (FieldAccessStats *)0x0) {
    iVar15 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    pcVar21 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])&stats);
    Output::Print(L"EquivObjTypeSpec: function %s (%s): inline cache stats unavailable\n",
                  CONCAT44(extraout_var_04,iVar15),pcVar21);
  }
  else {
    pCVar18 = CodeGenWorkItem::RecyclableData(workItem);
    pFVar19 = Js::CodeGenRecyclableData::JitTimeData(pCVar18);
    ppFVar20 = Memory::WriteBarrierPtr::operator_cast_to_FieldAccessStats__
                         ((WriteBarrierPtr *)&pFVar19->inlineCacheStats);
    Memory::WriteBarrierPtr<Js::FieldAccessStats>::WriteBarrierPtr(&local_90,*ppFVar20);
    iVar15 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    pcVar21 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])&stats);
    Output::Print(L"ObjTypeSpec: jitting function %s (#%s): inline cache stats:\n",
                  CONCAT44(extraout_var_03,iVar15),pcVar21);
    pFVar22 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->(&local_90);
    uVar1 = pFVar22->totalInlineCacheCount;
    pFVar22 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->(&local_90);
    Output::Print(L"    overall: total %u, no profile info %u\n",(ulong)uVar1,
                  (ulong)pFVar22->noInfoInlineCacheCount);
    pFVar22 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->(&local_90);
    uVar1 = pFVar22->monoInlineCacheCount;
    pFVar22 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->(&local_90);
    uVar2 = pFVar22->emptyMonoInlineCacheCount;
    pFVar22 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->(&local_90);
    Output::Print(L"    mono: total %u, empty %u, cloned %u\n",(ulong)uVar1,(ulong)uVar2,
                  (ulong)pFVar22->clonedMonoInlineCacheCount);
    pFVar22 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->(&local_90);
    uVar1 = pFVar22->polyInlineCacheCount;
    pFVar22 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->(&local_90);
    uVar2 = pFVar22->highUtilPolyInlineCacheCount;
    pFVar22 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->(&local_90);
    uVar3 = pFVar22->lowUtilPolyInlineCacheCount;
    pFVar22 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->(&local_90);
    uVar4 = pFVar22->nullPolyInlineCacheCount;
    pFVar22 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->(&local_90);
    uVar5 = pFVar22->emptyPolyInlineCacheCount;
    pFVar22 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->(&local_90);
    TVar6 = pFVar22->ignoredPolyInlineCacheCount;
    pFVar22 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->(&local_90);
    TVar7 = pFVar22->disabledPolyInlineCacheCount;
    pFVar22 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->(&local_90);
    TVar8 = pFVar22->equivPolyInlineCacheCount;
    pFVar22 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->(&local_90);
    TVar9 = pFVar22->nonEquivPolyInlineCacheCount;
    pFVar22 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->(&local_90);
    Output::Print(L"    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"
                  ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,TVar6,TVar7,
                  TVar8,TVar9,pFVar22->clonedPolyInlineCacheCount);
  }
  Output::Flush();
  return;
}

Assistant:

void NativeCodeGenerator::LogCodeGenStart(CodeGenWorkItem * workItem, LARGE_INTEGER * start_time)
{
    Js::FunctionBody * body = workItem->GetFunctionBody();
    {
        if (IS_JS_ETW(EventEnabledJSCRIPT_FUNCTION_JIT_START()))
        {
            WCHAR displayNameBuffer[256];
            WCHAR* displayName = displayNameBuffer;
            size_t sizeInChars = workItem->GetDisplayName(displayName, 256);
            if (sizeInChars > 256)
            {
                displayName = HeapNewArray(WCHAR, sizeInChars);
                workItem->GetDisplayName(displayName, 256);
            }
            JS_ETW(EventWriteJSCRIPT_FUNCTION_JIT_START(
                body->GetFunctionNumber(),
                displayName,
                body->GetScriptContext(),
                workItem->GetInterpretedCount(),
                (const unsigned int)body->LengthInBytes(),
                body->GetByteCodeCount(),
                body->GetByteCodeInLoopCount(),
                (int)workItem->GetJitMode()));

            if (displayName != displayNameBuffer)
            {
                HeapDeleteArray(sizeInChars, displayName);
            }
        }
    }

#if DBG_DUMP
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::BackEndPhase))
    {
        if (workItem->GetEntryPoint()->IsLoopBody())
        {
            Output::Print(_u("---BeginBackEnd: function: %s, loop:%d---\r\n"), body->GetDisplayName(), ((JsLoopBodyCodeGen*)workItem)->GetLoopNumber());
        }
        else
        {
            Output::Print(_u("---BeginBackEnd: function: %s---\r\n"), body->GetDisplayName());
        }
        Output::Flush();
    }
#endif

    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

    if (PHASE_TRACE(Js::BackEndPhase, body))
    {
        QueryPerformanceCounter(start_time);
        if (workItem->GetEntryPoint()->IsLoopBody())
        {
            Output::Print(
                _u("BeginBackEnd - function: %s (%s, line %u), loop: %u, mode: %S"),
                body->GetDisplayName(),
                body->GetDebugNumberSet(debugStringBuffer),
                body->GetLineNumber(),
                ((JsLoopBodyCodeGen*)workItem)->GetLoopNumber(),
                ExecutionModeName(workItem->GetJitMode()));
            if (body->GetIsAsmjsMode())
            {
                Output::Print(_u(" (Asmjs)\n"));
            }
            else
            {
                Output::Print(_u("\n"));
            }
        }
        else
        {
            Output::Print(
                _u("BeginBackEnd - function: %s (%s, line %u), mode: %S"),
                body->GetDisplayName(),
                body->GetDebugNumberSet(debugStringBuffer),
                body->GetLineNumber(),
                ExecutionModeName(workItem->GetJitMode()));

            if (body->GetIsAsmjsMode())
            {
                Output::Print(_u(" (Asmjs)\n"));
            }
            else
            {
                Output::Print(_u("\n"));
            }
        }
        Output::Flush();
    }

#ifdef FIELD_ACCESS_STATS
    if (PHASE_TRACE(Js::ObjTypeSpecPhase, body) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, body))
    {
        if (workItem->RecyclableData()->JitTimeData()->inlineCacheStats)
        {
            auto stats = workItem->RecyclableData()->JitTimeData()->inlineCacheStats;
            Output::Print(_u("ObjTypeSpec: jitting function %s (#%s): inline cache stats:\n"), body->GetDisplayName(), body->GetDebugNumberSet(debugStringBuffer));
            Output::Print(_u("    overall: total %u, no profile info %u\n"), stats->totalInlineCacheCount, stats->noInfoInlineCacheCount);
            Output::Print(_u("    mono: total %u, empty %u, cloned %u\n"),
                stats->monoInlineCacheCount, stats->emptyMonoInlineCacheCount, stats->clonedMonoInlineCacheCount);
            Output::Print(_u("    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"),
                stats->polyInlineCacheCount, stats->highUtilPolyInlineCacheCount, stats->lowUtilPolyInlineCacheCount,
                stats->nullPolyInlineCacheCount, stats->emptyPolyInlineCacheCount, stats->ignoredPolyInlineCacheCount, stats->disabledPolyInlineCacheCount,
                stats->equivPolyInlineCacheCount, stats->nonEquivPolyInlineCacheCount, stats->clonedPolyInlineCacheCount);
        }
        else
        {
            Output::Print(_u("EquivObjTypeSpec: function %s (%s): inline cache stats unavailable\n"), body->GetDisplayName(), body->GetDebugNumberSet(debugStringBuffer));
        }
        Output::Flush();
    }
#endif
}